

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomx.cpp
# Opt level: O3

randomx_cache * randomx_alloc_cache(randomx_flags flags)

{
  randomx_cache *cache;
  JitCompilerX86 *pJVar1;
  uint8_t *puVar2;
  size_type sVar3;
  char cVar4;
  size_t __n;
  long unaff_RBP;
  randomx_cache *__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  ulong uVar6;
  code *pcVar7;
  
  if ((flags & RANDOMX_FLAG_ARGON2_AVX2) == RANDOMX_FLAG_DEFAULT) {
    if ((flags & RANDOMX_FLAG_ARGON2_SSSE3) != RANDOMX_FLAG_DEFAULT) {
      pcVar7 = randomx_argon2_impl_ssse3();
      goto LAB_00123fb1;
    }
    pcVar7 = randomx_argon2_fill_segment_ref;
LAB_00123fbd:
    cache = (randomx_cache *)operator_new(0x83a8);
    paVar5 = &(cache->cacheKey).field_2;
    __s = cache;
    memset(cache,0,0x83a0);
    (cache->cacheKey)._M_dataplus._M_p = (pointer)paVar5;
    (cache->cacheKey).field_2._M_local_buf[0] = '\0';
    cache->argonImpl = pcVar7;
    uVar6 = (ulong)(flags & (RANDOMX_FLAG_JIT|RANDOMX_FLAG_LARGE_PAGES));
    cVar4 = (char)((long)&switchD_0012400d::switchdataD_001317fc +
                  (long)(int)(&switchD_0012400d::switchdataD_001317fc)[uVar6]);
    switch(flags & (RANDOMX_FLAG_JIT|RANDOMX_FLAG_LARGE_PAGES)) {
    case RANDOMX_FLAG_DEFAULT:
      cache->dealloc = randomx::deallocCache<randomx::AlignedAllocator<64ul>>;
      cache->jit = (JitCompiler *)0x0;
      cache->initialize = randomx::initCache;
      cache->datasetInit = randomx::initDataset;
      puVar2 = (uint8_t *)randomx::AlignedAllocator<64UL>::allocMemory(0x10000000);
      break;
    case RANDOMX_FLAG_LARGE_PAGES:
      cache->dealloc = randomx::deallocCache<randomx::LargePageAllocator>;
      cache->jit = (JitCompiler *)0x0;
      cache->initialize = randomx::initCache;
      cache->datasetInit = randomx::initDataset;
      puVar2 = (uint8_t *)randomx::LargePageAllocator::allocMemory(0x10000000);
      break;
    default:
      operator_delete(paVar5);
      if ((int)__n != 1) {
        _Unwind_Resume(&switchD_0012400d::switchdataD_001317fc);
      }
      __cxa_begin_catch(&switchD_0012400d::switchdataD_001317fc);
      if (cache != (randomx_cache *)0x0) {
        randomx_release_cache(cache);
      }
      __cxa_end_catch();
      goto LAB_00124157;
    case RANDOMX_FLAG_JIT:
      cache->dealloc = randomx::deallocCache<randomx::AlignedAllocator<64ul>>;
      pJVar1 = (JitCompilerX86 *)operator_new(0x48);
      randomx::JitCompilerX86::JitCompilerX86(pJVar1);
      cache->jit = pJVar1;
      cache->initialize = randomx::initCacheCompile;
      cache->datasetInit = (DatasetInitFunc *)pJVar1->code;
      puVar2 = (uint8_t *)randomx::AlignedAllocator<64UL>::allocMemory(0x10000000);
      break;
    case RANDOMX_FLAG_JIT|RANDOMX_FLAG_LARGE_PAGES:
      cache->dealloc = randomx::deallocCache<randomx::LargePageAllocator>;
      pJVar1 = (JitCompilerX86 *)operator_new(0x48);
      randomx::JitCompilerX86::JitCompilerX86(pJVar1);
      cache->jit = pJVar1;
      cache->initialize = randomx::initCacheCompile;
      cache->datasetInit = (DatasetInitFunc *)pJVar1->code;
      puVar2 = (uint8_t *)randomx::LargePageAllocator::allocMemory(0x10000000);
      break;
    case RANDOMX_FLAG_JIT|RANDOMX_FLAG_HARD_AES:
      if ((ulong)((long)&switchD_0012400d::switchdataD_001317fc +
                 (long)(int)(&switchD_0012400d::switchdataD_001317fc)[uVar6]) < 2) {
        return (randomx_cache *)(ulong)*(uint *)&__s->memory;
      }
      memset(__s,0,__n);
      cache[1].programs[0].programBuffer[0x139] = (Instruction)pcVar7;
      cache[1].programs[0].programBuffer[0x13b].opcode = '\0';
      paVar5->_M_allocated_capacity = (size_type)&PTR__VmBase_0013dbb8;
      sVar3 = paVar5->_M_allocated_capacity;
      if (uVar6 != 0) {
        (**(code **)(sVar3 + 0x30))(paVar5,uVar6);
        std::__cxx11::string::_M_assign((string *)(cache[1].programs[0].programBuffer + 0x139));
        sVar3 = paVar5->_M_allocated_capacity;
      }
      if (cache != (randomx_cache *)0x0) {
        (**(code **)(sVar3 + 0x28))(paVar5,cache);
        sVar3 = paVar5->_M_allocated_capacity;
      }
      (**(code **)(sVar3 + 0x10))(paVar5);
      return (randomx_cache *)paVar5;
    case RANDOMX_FLAG_JIT|RANDOMX_FLAG_HARD_AES|RANDOMX_FLAG_LARGE_PAGES:
      anon_var_dwarf_4b085[0x13] = cVar4 + 'a';
      halt_baddata();
    case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM:
      halt_baddata();
    case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM|RANDOMX_FLAG_LARGE_PAGES:
      *(char *)(unaff_RBP + 0x31) = *(char *)(unaff_RBP + 0x31) + -4;
      builtin_strncpy("hreadlist","irea",4);
      halt_baddata();
    case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM|RANDOMX_FLAG_HARD_AES:
      halt_baddata();
    case RANDOMX_FLAG_JIT|RANDOMX_FLAG_FULL_MEM|RANDOMX_FLAG_HARD_AES|RANDOMX_FLAG_LARGE_PAGES:
      anon_var_dwarf_4b085[0x13] = cVar4 + 'a';
      halt_baddata();
    }
    cache->memory = puVar2;
  }
  else {
    pcVar7 = randomx_argon2_impl_avx2();
LAB_00123fb1:
    if ((Instruction)pcVar7 != (Instruction)0x0) goto LAB_00123fbd;
LAB_00124157:
    cache = (randomx_cache *)0x0;
  }
  return cache;
}

Assistant:

randomx_cache *randomx_alloc_cache(randomx_flags flags) {
		randomx_cache *cache = nullptr;
		auto impl = randomx::selectArgonImpl(flags);
		if (impl == nullptr) {
			return cache;
		}

		try {
			cache = new randomx_cache();
			cache->argonImpl = impl;
			switch ((int)(flags & (RANDOMX_FLAG_JIT | RANDOMX_FLAG_LARGE_PAGES))) {
				case RANDOMX_FLAG_DEFAULT:
					cache->dealloc = &randomx::deallocCache<randomx::DefaultAllocator>;
					cache->jit = nullptr;
					cache->initialize = &randomx::initCache;
					cache->datasetInit = &randomx::initDataset;
					cache->memory = (uint8_t*)randomx::DefaultAllocator::allocMemory(randomx::CacheSize);
					break;

				case RANDOMX_FLAG_JIT:
					cache->dealloc = &randomx::deallocCache<randomx::DefaultAllocator>;
					cache->jit = new randomx::JitCompiler();
					cache->initialize = &randomx::initCacheCompile;
					cache->datasetInit = cache->jit->getDatasetInitFunc();
					cache->memory = (uint8_t*)randomx::DefaultAllocator::allocMemory(randomx::CacheSize);
					break;

				case RANDOMX_FLAG_LARGE_PAGES:
					cache->dealloc = &randomx::deallocCache<randomx::LargePageAllocator>;
					cache->jit = nullptr;
					cache->initialize = &randomx::initCache;
					cache->datasetInit = &randomx::initDataset;
					cache->memory = (uint8_t*)randomx::LargePageAllocator::allocMemory(randomx::CacheSize);
					break;

				case RANDOMX_FLAG_JIT | RANDOMX_FLAG_LARGE_PAGES:
					cache->dealloc = &randomx::deallocCache<randomx::LargePageAllocator>;
					cache->jit = new randomx::JitCompiler();
					cache->initialize = &randomx::initCacheCompile;
					cache->datasetInit = cache->jit->getDatasetInitFunc();
					cache->memory = (uint8_t*)randomx::LargePageAllocator::allocMemory(randomx::CacheSize);
					break;

				default:
					UNREACHABLE;
			}
		}
		catch (std::exception &ex) {
			if (cache != nullptr) {
				randomx_release_cache(cache);
				cache = nullptr;
			}
		}

		return cache;
	}